

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_shqput.c
# Opt level: O3

int main(void)

{
  int iVar1;
  QcShmQue *shmQue;
  char *__format;
  int idx;
  char *buff;
  int bufflen;
  QcErr err;
  int local_11c;
  char *local_118;
  int local_110;
  QcErr local_10c;
  
  shmQue = qc_shqueue_attach("shm_1","queue_2",&local_10c);
  if (shmQue == (QcShmQue *)0x0) {
    __format = "qc_shqueue_attach failed, err=%s.\n";
  }
  else {
    iVar1 = qc_shqueue_push_begin(shmQue,&local_11c,&local_118,&local_110,&local_10c);
    if (iVar1 < 0) {
      __format = "qc_shqueue_push_begin failed, err=%s.\n";
    }
    else {
      builtin_strncpy(local_118,"hello world!",0xc);
      iVar1 = qc_shqueue_push_end(shmQue,local_11c,0xc,&local_10c);
      if (-1 < iVar1) {
        printf("put message succeed, len=%d.\n",0xc);
        qc_shqueue_deattach(shmQue);
        exit(0);
      }
      __format = "qc_shqueue_push_end failed, err=%s.\n";
    }
  }
  printf(__format,local_10c.desc);
  exit(-1);
}

Assistant:

int main()
{
    int ret;
    QcErr err;
    int idx;
    char* buff;
    int bufflen, msglen;
    QcShmQue *shmQue;
    char *msg = "hello world!";
    
    shmQue = qc_shqueue_attach("shm_1", "queue_2", &err);
    if(NULL == shmQue)
    {
        printf("qc_shqueue_attach failed, err=%s.\n", err.desc);
        exit(-1);
    }


    ret = qc_shqueue_push_begin(shmQue, &idx, &buff, &bufflen, &err);
    if(ret < 0)
    {
        printf("qc_shqueue_push_begin failed, err=%s.\n", err.desc);
        exit(-1);
    }

    msglen = strlen(msg);
    strncpy(buff, msg, msglen);

    ret = qc_shqueue_push_end(shmQue, idx, msglen, &err);
    if (ret < 0)
    {
        printf("qc_shqueue_push_end failed, err=%s.\n", err.desc);
        exit(-1);
    }

    printf("put message succeed, len=%d.\n", msglen);

    qc_shqueue_deattach(shmQue);

    exit(0);
}